

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall JSON::Parser::readWordToken(Token *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  string value;
  char *local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar2 = this->pos;
  iVar4 = iVar2;
  if (iVar2 < this->length) {
    do {
      bVar3 = isWordChar((uint)(byte)(this->input)._M_dataplus._M_p[iVar4]);
      if (!bVar3) break;
      iVar4 = this->pos + 1;
      this->pos = iVar4;
    } while (iVar4 < this->length);
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->input);
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_40 + (long)local_48);
  iVar4 = this->pos;
  __return_storage_ptr__->type = WORD;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_68 == &local_58) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_50;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_68;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  }
  (__return_storage_ptr__->value)._M_string_length = local_60;
  local_60 = 0;
  local_58 = '\0';
  __return_storage_ptr__->start = iVar2;
  __return_storage_ptr__->end = iVar4;
  if (local_48 != local_38) {
    local_68 = &local_58;
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readWordToken() {
        int chunkStart = pos;
        while (isValidPos() && isWordChar(getCodeAt(pos))) {
            pos++;
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(WORD, value, chunkStart, pos);
    }